

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O3

int IDAHandleFailure(IDAMem IDA_mem,int sflag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  sunrealtype sVar5;
  sunrealtype sVar6;
  
  switch(sflag) {
  case -0x14:
    pcVar4 = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    IDA_mem = (IDAMem)0x0;
    iVar3 = -0x14;
    iVar1 = 0x95a;
    goto LAB_0010e203;
  case -0x11:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15g, the nonlinear solver failed in an unrecoverable manner.";
    iVar2 = -0x11;
    iVar3 = -0x11;
    iVar1 = 0x967;
    break;
  case -0x10:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15g, the nonlinear solver setup failed unrecoverably.";
    iVar2 = -0x10;
    iVar3 = -0x10;
    iVar1 = 0x963;
    break;
  case -0xb:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15gunable to satisfy inequality constraints.";
    iVar2 = -0xb;
    iVar3 = -0xb;
    iVar1 = 0x955;
    break;
  case -9:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15grepeated recoverable residual errors.";
    iVar2 = -9;
    iVar3 = -9;
    iVar1 = 0x94b;
    break;
  case -8:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15gthe residual function failed unrecoverably.";
    iVar2 = -8;
    iVar3 = -8;
    iVar1 = 0x950;
    break;
  case -7:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15gthe linear solver solve failed unrecoverably.";
    iVar2 = -7;
    iVar3 = -7;
    iVar1 = 0x946;
    break;
  case -6:
    sVar5 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15gthe linear solver setup failed unrecoverably.";
    iVar2 = -6;
    iVar3 = -6;
    iVar1 = 0x941;
    break;
  case -4:
    sVar5 = IDA_mem->ida_hh;
    sVar6 = IDA_mem->ida_tn;
    pcVar4 = 
    "At t = %.15g and h = %.15gthe corrector convergence failed repeatedly or with |h| = hmin.";
    iVar2 = -4;
    iVar3 = -4;
    iVar1 = 0x93c;
    goto LAB_0010e3d1;
  case -3:
    sVar5 = IDA_mem->ida_hh;
    sVar6 = IDA_mem->ida_tn;
    pcVar4 = "At t = %.15g and h = %.15gthe error test failed repeatedly or with |h| = hmin.";
    iVar2 = -3;
    iVar3 = -3;
    iVar1 = 0x937;
LAB_0010e3d1:
    IDAProcessError(IDA_mem,iVar3,iVar1,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,pcVar4,sVar6,sVar5);
    return iVar2;
  default:
    if (sflag == -9999) {
      sVar5 = IDA_mem->ida_tn;
      pcVar4 = "At t = %.15g, the nonlinear solver was passed a NULL input.";
      iVar2 = -0x14;
      iVar3 = -0x14;
      iVar1 = 0x95e;
      break;
    }
  case -0x13:
  case -0x12:
  case -0xf:
  case -0xe:
  case -0xd:
  case -0xc:
  case -10:
  case -5:
    pcVar4 = 
    "IDA encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
    ;
    iVar2 = -99;
    iVar3 = -99;
    iVar1 = 0x96d;
LAB_0010e203:
    IDAProcessError(IDA_mem,iVar3,iVar1,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,pcVar4);
    return iVar2;
  }
  IDAProcessError(IDA_mem,iVar3,iVar1,"IDAHandleFailure",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c",
                  pcVar4,sVar5);
  return iVar2;
}

Assistant:

static int IDAHandleFailure(IDAMem IDA_mem, int sflag)
{
  /* Depending on sflag, print error message and return error flag */
  switch (sflag)
  {
  case IDA_ERR_FAIL:
    IDAProcessError(IDA_mem, IDA_ERR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ERR_FAILS, IDA_mem->ida_tn, IDA_mem->ida_hh);
    return (IDA_ERR_FAIL);

  case IDA_CONV_FAIL:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_CONV_FAILS, IDA_mem->ida_tn, IDA_mem->ida_hh);
    return (IDA_CONV_FAIL);

  case IDA_LSETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SETUP_FAILED, IDA_mem->ida_tn);
    return (IDA_LSETUP_FAIL);

  case IDA_LSOLVE_FAIL:
    IDAProcessError(IDA_mem, IDA_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SOLVE_FAILED, IDA_mem->ida_tn);
    return (IDA_LSOLVE_FAIL);

  case IDA_REP_RES_ERR:
    IDAProcessError(IDA_mem, IDA_REP_RES_ERR, __LINE__, __func__, __FILE__,
                    MSG_REP_RES_ERR, IDA_mem->ida_tn);
    return (IDA_REP_RES_ERR);

  case IDA_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_RES_NONRECOV, IDA_mem->ida_tn);
    return (IDA_RES_FAIL);

  case IDA_CONSTR_FAIL:
    IDAProcessError(IDA_mem, IDA_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_FAILED_CONSTR, IDA_mem->ida_tn);
    return (IDA_CONSTR_FAIL);

  case IDA_MEM_NULL:
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);

  case SUN_ERR_ARG_CORRUPT:
    IDAProcessError(IDA_mem, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_NLS_INPUT_NULL, IDA_mem->ida_tn);
    return (IDA_MEM_NULL);

  case IDA_NLS_SETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_SETUP_FAILED, IDA_mem->ida_tn);
    return (IDA_NLS_SETUP_FAIL);
  case IDA_NLS_FAIL:
    IDAProcessError(IDA_mem, IDA_NLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_FAIL, IDA_mem->ida_tn);
    return (IDA_NLS_FAIL);
  }

  /* This return should never happen */
  IDAProcessError(IDA_mem, IDA_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                  "IDA encountered an unrecognized error. Please report this "
                  "to the Sundials developers at sundials-users@llnl.gov");
  return (IDA_UNRECOGNIZED_ERROR);
}